

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O0

UBool ucol_looksLikeCollationBinary_63(UDataSwapper *ds,void *inData,int32_t length)

{
  UBool UVar1;
  int iVar2;
  int32_t local_e0 [2];
  UCATableHeader header;
  UCATableHeader *inHeader;
  UDataInfo *info;
  UErrorCode errorCode;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if (((ds == (UDataSwapper *)0x0) || (inData == (void *)0x0)) || (length < -1)) {
    ds_local._7_1_ = '\0';
  }
  else {
    info._0_4_ = U_ZERO_ERROR;
    info._4_4_ = length;
    _errorCode = inData;
    inData_local = ds;
    udata_swapDataHeader_63(ds,inData,-1,(void *)0x0,(UErrorCode *)&info);
    UVar1 = U_SUCCESS((UErrorCode)info);
    if (((UVar1 == '\0') || (*(char *)((long)_errorCode + 0xc) != 'U')) ||
       ((*(char *)((long)_errorCode + 0xd) != 'C' ||
        ((*(char *)((long)_errorCode + 0xe) != 'o' || (*(char *)((long)_errorCode + 0xf) != 'l')))))
       ) {
      header.reserved._68_8_ = _errorCode;
      memset(local_e0,0,0xa8);
      iVar2 = info._4_4_;
      if (info._4_4_ < 0) {
        local_e0[0] = udata_readInt32_63((UDataSwapper *)inData_local,
                                         *(int32_t *)header.reserved._68_8_);
      }
      else if ((info._4_4_ < 0xa8) ||
              (local_e0[0] = udata_readInt32_63((UDataSwapper *)inData_local,
                                                *(int32_t *)header.reserved._68_8_),
              iVar2 < local_e0[0])) {
        return '\0';
      }
      iVar2 = (**(code **)((long)inData_local + 0x10))
                        (*(undefined4 *)(header.reserved._68_8_ + 0x10));
      if ((iVar2 == 0x20030618) && (*(char *)(header.reserved._68_8_ + 0x50) == '\x03')) {
        if ((*(char *)(header.reserved._68_8_ + 0x41) == *inData_local) &&
           (*(char *)(header.reserved._68_8_ + 0x42) == *(char *)((long)inData_local + 1))) {
          ds_local._7_1_ = '\x01';
        }
        else {
          ds_local._7_1_ = '\0';
        }
      }
      else {
        ds_local._7_1_ = '\0';
      }
    }
    else {
      ds_local._7_1_ = '\x01';
    }
  }
  return ds_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucol_looksLikeCollationBinary(const UDataSwapper *ds,
                              const void *inData, int32_t length) {
    if(ds==NULL || inData==NULL || length<-1) {
        return FALSE;
    }

    // First check for format version 4+ which has a standard data header.
    UErrorCode errorCode=U_ZERO_ERROR;
    (void)udata_swapDataHeader(ds, inData, -1, NULL, &errorCode);
    if(U_SUCCESS(errorCode)) {
        const UDataInfo &info=*(const UDataInfo *)((const char *)inData+4);
        if(info.dataFormat[0]==0x55 &&   // dataFormat="UCol"
                info.dataFormat[1]==0x43 &&
                info.dataFormat[2]==0x6f &&
                info.dataFormat[3]==0x6c) {
            return TRUE;
        }
    }

    // Else check for format version 3.
    const UCATableHeader *inHeader=(const UCATableHeader *)inData;

    /*
     * The collation binary must contain at least the UCATableHeader,
     * starting with its size field.
     * sizeof(UCATableHeader)==42*4 in ICU 2.8
     * check the length against the header size before reading the size field
     */
    UCATableHeader header;
    uprv_memset(&header, 0, sizeof(header));
    if(length<0) {
        header.size=udata_readInt32(ds, inHeader->size);
    } else if((length<(42*4) || length<(header.size=udata_readInt32(ds, inHeader->size)))) {
        return FALSE;
    }

    header.magic=ds->readUInt32(inHeader->magic);
    if(!(
        header.magic==UCOL_HEADER_MAGIC &&
        inHeader->formatVersion[0]==3 /*&&
        inHeader->formatVersion[1]>=0*/
    )) {
        return FALSE;
    }

    if(inHeader->isBigEndian!=ds->inIsBigEndian || inHeader->charSetFamily!=ds->inCharset) {
        return FALSE;
    }

    return TRUE;
}